

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnRelocCount
          (BinaryReaderObjdump *this,Index count,Index section_index)

{
  uint uVar1;
  size_type sVar2;
  const_pointer pvVar3;
  string_view local_48;
  string_view local_38;
  Enum local_24;
  uint local_20;
  Index local_1c;
  Index section_index_local;
  Index count_local;
  BinaryReaderObjdump *this_local;
  
  local_20 = section_index;
  local_1c = count;
  _section_index_local = this;
  local_24 = (Enum)BinaryReaderObjdumpBase::OnRelocCount
                             (&this->super_BinaryReaderObjdumpBase,count,section_index);
  uVar1 = local_20;
  local_38 = BinaryReaderObjdumpBase::GetSectionName(&this->super_BinaryReaderObjdumpBase,local_20);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_38);
  local_48 = BinaryReaderObjdumpBase::GetSectionName(&this->super_BinaryReaderObjdumpBase,local_20);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_48);
  PrintDetails(this,"  - relocations for section: %d (%.*s) [%d]\n",(ulong)uVar1,sVar2 & 0xffffffff,
               pvVar3,(ulong)local_1c);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReaderObjdump::OnRelocCount(Index count, Index section_index) {
  BinaryReaderObjdumpBase::OnRelocCount(count, section_index);
  PrintDetails("  - relocations for section: %d (" PRIstringview ") [%d]\n",
               section_index,
               WABT_PRINTF_STRING_VIEW_ARG(GetSectionName(section_index)),
               count);
  return Result::Ok;
}